

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo * __thiscall testing::TestCase::GetMutableTestInfo(TestCase *this,int i)

{
  long lVar1;
  int iVar2;
  reference ppTVar3;
  long in_FS_OFFSET;
  value_type local_30;
  int index;
  int i_local;
  TestCase *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = internal::GetElementOr<int>(&this->test_indices_,i,-1);
  if (iVar2 < 0) {
    local_30 = (value_type)0x0;
  }
  else {
    ppTVar3 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                        (&this->test_info_list_,(long)iVar2);
    local_30 = *ppTVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

TestInfo* TestCase::GetMutableTestInfo(int i) {
  const int index = GetElementOr(test_indices_, i, -1);
  return index < 0 ? NULL : test_info_list_[index];
}